

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_serial_impl_deserialize.c
# Opt level: O0

int metacall_serial_impl_deserialize_int(value *v,char *src,size_t length)

{
  int iVar1;
  ushort **ppuVar2;
  long lVar3;
  ulong in_RDX;
  char *in_RSI;
  long *in_RDI;
  size_t iterator;
  ulong local_28;
  uint local_4;
  
  ppuVar2 = __ctype_b_loc();
  if (((((*ppuVar2)[(int)*in_RSI] & 0x800) == 0) && (*in_RSI != '-')) && (*in_RSI != '+')) {
    local_4 = 1;
  }
  else {
    for (local_28 = 1; local_28 < in_RDX; local_28 = local_28 + 1) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)in_RSI[local_28]] & 0x800) == 0) {
        return 1;
      }
    }
    iVar1 = atoi(in_RSI);
    lVar3 = value_create_int(iVar1);
    *in_RDI = lVar3;
    local_4 = (uint)(*in_RDI == 0);
  }
  return local_4;
}

Assistant:

int metacall_serial_impl_deserialize_int(value *v, const char *src, size_t length)
{
	size_t iterator;

	if (isdigit((int)src[0]) == 0 && src[0] != '-' && src[0] != '+')
	{
		return 1;
	}

	for (iterator = 1; iterator < length; ++iterator)
	{
		if (isdigit((int)src[iterator]) == 0)
		{
			return 1;
		}
	}

	*v = value_create_int(atoi(src));

	return (*v == NULL);
}